

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::
     RenderLineSegments<ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::GetterXsYRef<unsigned_long_long>,ImPlot::TransformerLinLog>
               (GetterXsYs<unsigned_long_long> *getter1,GetterXsYRef<unsigned_long_long> *getter2,
               TransformerLinLog *transformer,ImDrawList *DrawList,float line_weight,ImU32 col)

{
  float *pfVar1;
  unsigned_long_long uVar2;
  unsigned_long_long uVar3;
  double dVar4;
  ImVec2 IVar5;
  int iVar6;
  int iVar7;
  ImPlotPlot *pIVar8;
  ImPlotContext *pIVar9;
  ImPlotContext *pIVar10;
  ImPlotContext *pIVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  double dVar15;
  float fVar16;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_60;
  undefined1 local_58 [8];
  GetterXsYRef<unsigned_long_long> *local_50;
  TransformerLinLog *local_48;
  int local_40;
  ImU32 local_3c;
  float local_38;
  
  pIVar9 = GImPlot;
  if (((GImPlot->CurrentPlot->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true))
  {
    local_40 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      local_40 = getter1->Count;
    }
    local_58 = (undefined1  [8])getter1;
    local_50 = getter2;
    local_48 = transformer;
    local_3c = col;
    local_38 = line_weight;
    RenderPrimitives<ImPlot::LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::GetterXsYRef<unsigned_long_long>,ImPlot::TransformerLinLog>>
              ((LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLinLog>
                *)local_58,DrawList,&GImPlot->CurrentPlot->PlotRect);
  }
  else {
    iVar13 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      iVar13 = getter1->Count;
    }
    if (0 < iVar13) {
      iVar14 = 0;
      do {
        pIVar10 = GImPlot;
        iVar6 = getter1->Count;
        lVar12 = (long)(((getter1->Offset + iVar14) % iVar6 + iVar6) % iVar6) *
                 (long)getter1->Stride;
        uVar2 = *(unsigned_long_long *)((long)getter1->Xs + lVar12);
        uVar3 = *(unsigned_long_long *)((long)getter1->Ys + lVar12);
        dVar15 = log10((((double)CONCAT44(0x45300000,(int)(uVar3 >> 0x20)) - 1.9342813113834067e+25)
                       + ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) /
                       GImPlot->CurrentPlot->YAxis[transformer->YAxis].Range.Min);
        pIVar11 = GImPlot;
        iVar6 = transformer->YAxis;
        pIVar8 = pIVar10->CurrentPlot;
        dVar4 = pIVar8->YAxis[iVar6].Range.Min;
        IVar5 = pIVar10->PixelRange[iVar6].Min;
        local_58._0_4_ =
             (undefined4)
             (pIVar10->Mx *
              ((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) -
              (pIVar8->XAxis).Range.Min) + (double)IVar5.x);
        local_58._4_4_ =
             (undefined4)
             (pIVar10->My[iVar6] *
              (((double)(float)(dVar15 / pIVar10->LogDenY[iVar6]) *
                (pIVar8->YAxis[iVar6].Range.Max - dVar4) + dVar4) - dVar4) + (double)IVar5.y);
        iVar7 = getter2->Count;
        uVar2 = *(unsigned_long_long *)
                 ((long)getter2->Xs +
                 (long)(((getter2->Offset + iVar14) % iVar7 + iVar7) % iVar7) *
                 (long)getter2->Stride);
        dVar15 = log10(getter2->YRef / GImPlot->CurrentPlot->YAxis[iVar6].Range.Min);
        iVar6 = transformer->YAxis;
        pIVar8 = pIVar11->CurrentPlot;
        dVar4 = pIVar8->YAxis[iVar6].Range.Min;
        IVar5 = pIVar11->PixelRange[iVar6].Min;
        local_60.x = (float)(pIVar11->Mx *
                             ((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) -
                               1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) -
                             (pIVar8->XAxis).Range.Min) + (double)IVar5.x);
        local_60.y = (float)(pIVar11->My[iVar6] *
                             (((double)(float)(dVar15 / pIVar11->LogDenY[iVar6]) *
                               (pIVar8->YAxis[iVar6].Range.Max - dVar4) + dVar4) - dVar4) +
                            (double)IVar5.y);
        pIVar8 = pIVar9->CurrentPlot;
        fVar16 = (float)local_58._4_4_;
        if (local_60.y <= (float)local_58._4_4_) {
          fVar16 = local_60.y;
        }
        if ((fVar16 < (pIVar8->PlotRect).Max.y) &&
           (fVar16 = (float)(~-(uint)(local_60.y <= (float)local_58._4_4_) & (uint)local_60.y |
                            local_58._4_4_ & -(uint)(local_60.y <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar8->PlotRect).Min.y, *pfVar1 <= fVar16 && fVar16 != *pfVar1)) {
          fVar16 = (float)local_58._0_4_;
          if (local_60.x <= (float)local_58._0_4_) {
            fVar16 = local_60.x;
          }
          if ((fVar16 < (pIVar8->PlotRect).Max.x) &&
             (fVar16 = (float)(-(uint)(local_60.x <= (float)local_58._0_4_) & local_58._0_4_ |
                              ~-(uint)(local_60.x <= (float)local_58._0_4_) & (uint)local_60.x),
             (pIVar8->PlotRect).Min.x <= fVar16 && fVar16 != (pIVar8->PlotRect).Min.x)) {
            ImDrawList::AddLine(DrawList,(ImVec2 *)local_58,&local_60,col,line_weight);
          }
        }
        iVar14 = iVar14 + 1;
      } while (iVar13 != iVar14);
    }
  }
  return;
}

Assistant:

inline void RenderLineSegments(const Getter1& getter1, const Getter2& getter2, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        int I = ImMin(getter1.Count, getter2.Count);
        for (int i = 0; i < I; ++i) {
            ImVec2 p1 = transformer(getter1(i));
            ImVec2 p2 = transformer(getter2(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
        }
    }
    else {
        RenderPrimitives(LineSegmentsRenderer<Getter1,Getter2,Transformer>(getter1, getter2, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}